

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O3

void __thiscall
QNetworkAccessBackendFactory::~QNetworkAccessBackendFactory(QNetworkAccessBackendFactory *this)

{
  Type *c;
  long in_FS_OFFSET;
  QNetworkAccessBackendFactory *local_20;
  anon_class_8_1_54a39814_for__M_pred local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_002ca618;
  if ((__atomic_base<signed_char>)
      QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>::guard._q_value.
      super___atomic_base<signed_char>._M_i == -1) {
    c = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_factoryData>_>::instance()
    ;
    local_18.t = (QNetworkAccessBackendFactory **)&local_20;
    local_20 = this;
    QtPrivate::
    sequential_erase_if<QList<QNetworkAccessBackendFactory*>,QtPrivate::sequential_erase<QList<QNetworkAccessBackendFactory*>,QNetworkAccessBackendFactory*>(QList<QNetworkAccessBackendFactory*>&,QNetworkAccessBackendFactory*const&)::_lambda(auto:1_const&)_1_>
              (&c->super_QList<QNetworkAccessBackendFactory_*>,&local_18);
  }
  QObject::~QObject((QObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkAccessBackendFactory::~QNetworkAccessBackendFactory()
{
    if (factoryData.exists())
        factoryData->removeAll(this);
}